

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

ly_bool lys_has_dep_mods(lys_module *mod)

{
  lysp_module *plVar1;
  lysp_include *plVar2;
  lysp_submodule **pplVar3;
  ulong uVar4;
  lysp_include *plVar5;
  ulong uVar6;
  
  plVar1 = mod->parsed;
  if ((plVar1->features == (lysp_feature *)0x0) && (plVar1->groupings == (lysp_node_grp *)0x0)) {
    plVar2 = plVar1->includes;
    uVar4 = 0xffffffffffffffff;
    plVar5 = plVar2;
    do {
      if (plVar2 == (lysp_include *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)(plVar2[-1].rev + 8);
      }
      uVar4 = uVar4 + 1;
      if (uVar6 <= uVar4) {
        if (plVar1->augments != (lysp_node_augment *)0x0) {
          return '\x01';
        }
        uVar4 = 0xffffffffffffffff;
        plVar5 = plVar2;
        while( true ) {
          if (plVar2 == (lysp_include *)0x0) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ulong *)(plVar2[-1].rev + 8);
          }
          uVar4 = uVar4 + 1;
          if (uVar6 <= uVar4) break;
          pplVar3 = &plVar5->submodule;
          plVar5 = plVar5 + 1;
          if ((*pplVar3)->augments != (lysp_node_augment *)0x0) {
            return '\x01';
          }
        }
        return '\0';
      }
      pplVar3 = &plVar5->submodule;
      plVar5 = plVar5 + 1;
    } while ((*pplVar3)->groupings == (lysp_node_grp *)0x0);
  }
  return '\x01';
}

Assistant:

ly_bool
lys_has_dep_mods(const struct lys_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;

    /* features */
    if (mod->parsed->features) {
        return 1;
    }

    /* groupings */
    if (mod->parsed->groupings) {
        return 1;
    }
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (mod->parsed->includes[u].submodule->groupings) {
            return 1;
        }
    }

    /* augments (adding nodes with leafrefs) */
    if (mod->parsed->augments) {
        return 1;
    }
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (mod->parsed->includes[u].submodule->augments) {
            return 1;
        }
    }

    return 0;
}